

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

String * __thiscall
capnp::compiler::ValueTranslator::makeNodeName
          (String *__return_storage_ptr__,ValueTranslator *this,Schema schema)

{
  String *result;
  char *__dest;
  ulong uVar1;
  size_t __n;
  Reader RVar2;
  Reader proto;
  Reader local_80;
  Schema local_50;
  PointerReader local_48;
  
  local_50.raw = schema.raw;
  Schema::getProto(&local_80,&local_50);
  if (local_80._reader.pointerCount == 0) {
    local_80._reader.nestingLimit = 0x7fffffff;
    local_80._reader.capTable = (CapTableReader *)0x0;
    local_80._reader.pointers = (WirePointer *)0x0;
    local_80._reader.segment = (SegmentReader *)0x0;
  }
  uVar1 = 0;
  local_48.segment = local_80._reader.segment;
  local_48.capTable = local_80._reader.capTable;
  local_48.pointer = local_80._reader.pointers;
  local_48.nestingLimit = local_80._reader.nestingLimit;
  RVar2 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_48,(void *)0x0,0);
  if (0x5f < local_80._reader.dataSize) {
    uVar1 = (ulong)*(uint *)((long)local_80._reader.data + 8);
  }
  kj::heapString(__return_storage_ptr__,RVar2.super_StringPtr.content.size_ + ~uVar1);
  __n = ~uVar1 + RVar2.super_StringPtr.content.size_;
  if (__n != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,RVar2.super_StringPtr.content.ptr + uVar1,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeNodeName(Schema schema) {
  schema::Node::Reader proto = schema.getProto();
  return kj::str(proto.getDisplayName().slice(proto.getDisplayNamePrefixLength()));
}